

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labpack-writer.c
# Opt level: O0

void labpack_writer_init(labpack_writer_t *writer)

{
  mpack_writer_t *pmVar1;
  labpack_writer_t *writer_local;
  
  if (writer != (labpack_writer_t *)0x0) {
    pmVar1 = (mpack_writer_t *)malloc(0x58);
    writer->encoder = pmVar1;
    if (writer->encoder == (mpack_writer_t *)0x0) {
      writer->status = LABPACK_STATUS_ERROR_OUT_OF_MEMORY;
      writer->status_message = "Not enough memory available to create internal encoder";
    }
    else {
      labpack_writer_reset_status(writer);
    }
    writer->buffer = (char *)0x0;
    writer->size = 0;
    return;
  }
  __assert_fail("writer",
                "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/src/labpack-writer.c"
                ,0x4c,"void labpack_writer_init(labpack_writer_t *)");
}

Assistant:

static void
labpack_writer_init(labpack_writer_t* writer)
{
    assert(writer);
    writer->encoder = malloc(sizeof(mpack_writer_t));
    if (writer->encoder) {
        labpack_writer_reset_status(writer);
    } else {
        writer->status = LABPACK_STATUS_ERROR_OUT_OF_MEMORY;
        writer->status_message = "Not enough memory available to create internal encoder";
    }
    writer->buffer = NULL;
    writer->size = 0;
}